

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_radio.c
# Opt level: O3

void radio_bang(t_radio *x)

{
  t_pd *pp_Var1;
  t_float f;
  t_atom at [2];
  t_atom local_28;
  undefined4 local_18;
  undefined4 local_10;
  
  if (x->x_compat == 0) {
    if (pd_compatibilitylevel < 0x2e) {
      f = (t_float)x->x_on;
    }
    else {
      f = x->x_fval;
    }
    outlet_float((x->x_gui).x_obj.te_outlet,f);
    if ((((uint)(x->x_gui).x_fsf & 0x80) != 0) &&
       (pp_Var1 = ((x->x_gui).x_snd)->s_thing, pp_Var1 != (t_pd *)0x0)) {
      pd_float(pp_Var1,f);
      return;
    }
  }
  else {
    if ((x->x_change != 0) && (x->x_on != x->x_on_old)) {
      local_28.a_type = A_FLOAT;
      local_28.a_w.w_float = (t_float)x->x_on_old;
      local_18 = 1;
      local_10 = 0;
      outlet_list((x->x_gui).x_obj.te_outlet,&s_list,2,&local_28);
      if ((((uint)(x->x_gui).x_fsf & 0x80) != 0) &&
         (pp_Var1 = ((x->x_gui).x_snd)->s_thing, pp_Var1 != (t_pd *)0x0)) {
        pd_list(pp_Var1,&s_list,2,&local_28);
      }
    }
    x->x_on_old = x->x_on;
    local_28.a_type = A_FLOAT;
    local_28.a_w.w_float = (t_float)x->x_on;
    local_18 = 1;
    local_10 = 0x3f800000;
    outlet_list((x->x_gui).x_obj.te_outlet,&s_list,2,&local_28);
    if ((((uint)(x->x_gui).x_fsf & 0x80) != 0) &&
       (pp_Var1 = ((x->x_gui).x_snd)->s_thing, pp_Var1 != (t_pd *)0x0)) {
      pd_list(pp_Var1,&s_list,2,&local_28);
    }
  }
  return;
}

Assistant:

static void radio_bang(t_radio *x)
{
    if(x->x_compat)
    {
            /* compatibility with earlier "[hv]dial" behavior */
        t_atom at[2];
        if((x->x_change) && (x->x_on != x->x_on_old))
        {
            SETFLOAT(at+0, (t_float)x->x_on_old);
            SETFLOAT(at+1, 0.0);
            outlet_list(x->x_gui.x_obj.ob_outlet, &s_list, 2, at);
            if(x->x_gui.x_fsf.x_snd_able && x->x_gui.x_snd->s_thing)
                pd_list(x->x_gui.x_snd->s_thing, &s_list, 2, at);
        }
        x->x_on_old = x->x_on;
        SETFLOAT(at+0, (t_float)x->x_on);
        SETFLOAT(at+1, 1.0);
        outlet_list(x->x_gui.x_obj.ob_outlet, &s_list, 2, at);
        if(x->x_gui.x_fsf.x_snd_able && x->x_gui.x_snd->s_thing)
            pd_list(x->x_gui.x_snd->s_thing, &s_list, 2, at);
    }
    else
    {
        t_float outval = (pd_compatibilitylevel < 46 ? x->x_on : x->x_fval);
        outlet_float(x->x_gui.x_obj.ob_outlet, outval);
        if(x->x_gui.x_fsf.x_snd_able && x->x_gui.x_snd->s_thing)
            pd_float(x->x_gui.x_snd->s_thing, outval);
    }
}